

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::push(cubeb_async_logger *this,char *str)

{
  bool bVar1;
  __pointer_type __p;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  memory_order in_stack_0000000c;
  ring_buffer_base<cubeb_log_message> *owned_queue;
  cubeb_log_message msg;
  cubeb_log_message *in_stack_fffffffffffffed8;
  atomic<ring_buffer_base<cubeb_log_message>_*> *in_stack_fffffffffffffee8;
  atomic<ring_buffer_base<cubeb_log_message>_*> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  cubeb_log_message *in_stack_ffffffffffffff00;
  
  cubeb_log_message::cubeb_log_message(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  __p = std::atomic<ring_buffer_base<cubeb_log_message>_*>::load
                  (in_stack_fffffffffffffee8,(memory_order)((ulong)in_RDI >> 0x20));
  if ((__p != (__pointer_type)0x0) &&
     (bVar1 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::compare_exchange_strong
                        ((atomic<ring_buffer_base<cubeb_log_message>_*> *)msg.storage._8_8_,
                         (__pointer_type *)msg.storage._0_8_,owned_queue,in_stack_0000000c), bVar1))
  {
    ring_buffer_base<cubeb_log_message>::enqueue(in_RDI,in_stack_fffffffffffffed8);
    std::atomic<ring_buffer_base<cubeb_log_message>_*>::store
              (in_stack_fffffffffffffef0,__p,(memory_order)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void push(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    cubeb_log_message msg(str);
    auto * owned_queue = msg_queue.load();
    // Check if the queue is being deallocated. If not, grab ownership. If yes,
    // return, the message won't be logged.
    if (!owned_queue ||
        !msg_queue.compare_exchange_strong(owned_queue, nullptr)) {
      return;
    }
    owned_queue->enqueue(msg);
    // Return ownership.
    msg_queue.store(owned_queue);
  }